

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressSequences_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  ZSTD_sequencePosition seqPos_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ZSTD_sequenceCopier entropyWkspSize;
  BYTE *pBVar4;
  ZSTD_CCtx_params *code;
  seqStore_t *seqStorePtr;
  BYTE *code_00;
  ZSTD_Sequence *in_RCX;
  ulong in_RDX;
  BYTE *in_RSI;
  ZSTD_CCtx *in_RDI;
  size_t in_R8;
  void *in_R9;
  ZSTD_entropyCTables_t *in_stack_00000008;
  U32 cBlockHeader;
  size_t err_code_5;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U32 lastBlock;
  size_t blockSize;
  size_t additionalByteAdjustment;
  size_t cBlockSize;
  size_t compressedSeqsSize;
  U32 cBlockHeader24;
  ZSTD_sequenceCopier sequenceCopier;
  BYTE *op;
  BYTE *ip;
  ZSTD_sequencePosition seqPos;
  size_t remaining;
  size_t cSize;
  undefined8 in_stack_ffffffffffffff08;
  ZSTD_sequenceFormat_e mode;
  U32 UVar5;
  void *in_stack_ffffffffffffff10;
  size_t srcSize_00;
  U32 *memPtr;
  void *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  void *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  void *pvVar6;
  size_t in_stack_ffffffffffffff40;
  BYTE *in_stack_ffffffffffffff48;
  ZSTD_CCtx_params *in_stack_ffffffffffffff50;
  ZSTD_entropyCTables_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  ZSTD_entropyCTables_t *pZVar7;
  seqStore_t *psVar8;
  void *local_88;
  size_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  void *local_60;
  ZSTD_sequencePosition local_58;
  ZSTD_entropyCTables_t *local_48;
  BYTE *local_40;
  void *local_38;
  size_t local_30;
  ZSTD_Sequence *local_28;
  ulong local_20;
  BYTE *local_18;
  ZSTD_CCtx *local_10;
  
  mode = (ZSTD_sequenceFormat_e)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_40 = (BYTE *)0x0;
  local_48 = in_stack_00000008;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_58,0,0x10);
  local_60 = local_38;
  entropyWkspSize = ZSTD_selectSequenceCopier(mode);
  pBVar4 = local_18;
  if (local_48 == (ZSTD_entropyCTables_t *)0x0) {
    in_stack_ffffffffffffff8c = 1;
    if (local_20 < 4) {
      return 0xffffffffffffffba;
    }
    MEM_writeLE32(in_stack_ffffffffffffff10,mode);
    pBVar4 = local_18 + 3;
    local_20 = local_20 - 3;
    local_40 = local_40 + 3;
  }
  do {
    while( true ) {
      if (local_48 == (ZSTD_entropyCTables_t *)0x0) {
        return (size_t)local_40;
      }
      seqPos_00.posInSrc = (size_t)in_stack_ffffffffffffff58;
      seqPos_00._0_8_ = in_stack_ffffffffffffff50;
      srcSize_00 = local_58.posInSrc;
      UVar5 = local_58.posInSequence;
      in_stack_ffffffffffffff58 =
           (ZSTD_entropyCTables_t *)
           determine_blockSize((ZSTD_sequenceFormat_e)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                               (size_t)in_stack_ffffffffffffff30,
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (ZSTD_Sequence *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (size_t)in_stack_ffffffffffffff18,seqPos_00);
      uVar2 = (uint)(in_stack_ffffffffffffff58 == local_48);
      pZVar7 = in_stack_ffffffffffffff58;
      uVar1 = ERR_isError((size_t)in_stack_ffffffffffffff58);
      if (uVar1 != 0) {
        return (size_t)in_stack_ffffffffffffff58;
      }
      if (local_48 < pZVar7) {
        __assert_fail("blockSize <= remaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6aec,
                      "size_t ZSTD_compressSequences_internal(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                     );
      }
      ZSTD_resetSeqStore(&local_10->seqStore);
      code = (ZSTD_CCtx_params *)
             (*entropyWkspSize)(local_10,&local_58,local_28,local_30,local_60,(size_t)pZVar7,
                                (local_10->appliedParams).searchForExternalRepcodes);
      in_stack_ffffffffffffff50 = code;
      uVar1 = ERR_isError((size_t)code);
      if (uVar1 != 0) {
        return (size_t)in_stack_ffffffffffffff50;
      }
      seqStorePtr = (seqStore_t *)((long)pZVar7 - (long)code);
      if ((seqStore_t *)0x6 < seqStorePtr) break;
      code_00 = (BYTE *)ZSTD_noCompressBlock
                                  ((void *)CONCAT44(in_stack_ffffffffffffff2c,
                                                    in_stack_ffffffffffffff28),
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff18,srcSize_00,UVar5);
      in_stack_ffffffffffffff48 = code_00;
      uVar2 = ERR_isError((size_t)code_00);
      if (uVar2 != 0) {
        return (size_t)in_stack_ffffffffffffff48;
      }
      local_40 = code_00 + (long)local_40;
      local_60 = (void *)((long)&seqStorePtr->sequencesStart + (long)local_60);
      local_48 = (ZSTD_entropyCTables_t *)((long)local_48 - (long)seqStorePtr);
      local_20 = local_20 - (long)code_00;
      pBVar4 = code_00 + (long)pBVar4;
    }
    if (local_20 < 3) {
      return 0xffffffffffffffba;
    }
    memPtr = local_10->entropyWorkspace;
    in_stack_ffffffffffffff20 = local_10->bmi2;
    in_stack_ffffffffffffff18 = (void *)0x22d8;
    psVar8 = seqStorePtr;
    in_stack_ffffffffffffff40 =
         ZSTD_entropyCompressSeqStore
                   (seqStorePtr,(ZSTD_entropyCTables_t *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    in_stack_ffffffffffffff40,in_stack_ffffffffffffff80,
                    (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (size_t)entropyWkspSize,(int)pBVar4);
    UVar5 = (U32)((ulong)seqStorePtr >> 0x20);
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff40;
    uVar1 = ERR_isError(in_stack_ffffffffffffff40);
    if (uVar1 != 0) {
      return in_stack_ffffffffffffff40;
    }
    if (((local_10->isFirstBlock == 0) && (iVar3 = ZSTD_maybeRLE(&local_10->seqStore), iVar3 != 0))
       && (iVar3 = ZSTD_isRLE(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40), iVar3 != 0)) {
      in_stack_ffffffffffffff80 = 1;
    }
    if (in_stack_ffffffffffffff80 == 0) {
      local_88 = (void *)ZSTD_noCompressBlock
                                   ((void *)CONCAT44(in_stack_ffffffffffffff2c,
                                                     in_stack_ffffffffffffff28),
                                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                    in_stack_ffffffffffffff18,(size_t)memPtr,UVar5);
      pvVar6 = local_88;
      uVar1 = ERR_isError((size_t)local_88);
      in_stack_ffffffffffffff38 = pvVar6;
joined_r0x0024322f:
      if (uVar1 != 0) {
        return (size_t)pvVar6;
      }
    }
    else {
      if (in_stack_ffffffffffffff80 == 1) {
        local_88 = (void *)ZSTD_rleCompressBlock
                                     (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                                      (BYTE)((uint)in_stack_ffffffffffffff2c >> 0x18),
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      (U32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        in_stack_ffffffffffffff30 = local_88;
        uVar1 = ERR_isError((size_t)local_88);
        pvVar6 = in_stack_ffffffffffffff30;
        goto joined_r0x0024322f;
      }
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&local_10->blockState);
      if ((((local_10->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid)
      {
        (((local_10->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      in_stack_ffffffffffffff2c = uVar2 + 4 + (int)(in_stack_ffffffffffffff80 << 3);
      MEM_writeLE24(memPtr,UVar5);
      local_88 = (void *)(in_stack_ffffffffffffff80 + 3);
    }
    local_40 = (BYTE *)((long)local_88 + (long)local_40);
    if (uVar2 != 0) {
      return (size_t)local_40;
    }
    local_60 = (void *)((long)&psVar8->sequencesStart + (long)local_60);
    local_48 = (ZSTD_entropyCTables_t *)((long)local_48 - (long)psVar8);
    local_20 = local_20 - (long)local_88;
    local_10->isFirstBlock = 0;
    pBVar4 = (BYTE *)((long)local_88 + (long)pBVar4);
  } while( true );
}

Assistant:

static size_t
ZSTD_compressSequences_internal(ZSTD_CCtx* cctx,
                                void* dst, size_t dstCapacity,
                          const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                          const void* src, size_t srcSize)
{
    size_t cSize = 0;
    size_t remaining = srcSize;
    ZSTD_sequencePosition seqPos = {0, 0, 0};

    BYTE const* ip = (BYTE const*)src;
    BYTE* op = (BYTE*)dst;
    ZSTD_sequenceCopier const sequenceCopier = ZSTD_selectSequenceCopier(cctx->appliedParams.blockDelimiters);

    DEBUGLOG(4, "ZSTD_compressSequences_internal srcSize: %zu, inSeqsSize: %zu", srcSize, inSeqsSize);
    /* Special case: empty frame */
    if (remaining == 0) {
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "No room for empty frame block header");
        MEM_writeLE32(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
        cSize += ZSTD_blockHeaderSize;
    }

    while (remaining) {
        size_t compressedSeqsSize;
        size_t cBlockSize;
        size_t additionalByteAdjustment;
        size_t blockSize = determine_blockSize(cctx->appliedParams.blockDelimiters,
                                        cctx->blockSize, remaining,
                                        inSeqs, inSeqsSize, seqPos);
        U32 const lastBlock = (blockSize == remaining);
        FORWARD_IF_ERROR(blockSize, "Error while trying to determine block size");
        assert(blockSize <= remaining);
        ZSTD_resetSeqStore(&cctx->seqStore);
        DEBUGLOG(5, "Working on new block. Blocksize: %zu (total:%zu)", blockSize, (ip - (const BYTE*)src) + blockSize);

        additionalByteAdjustment = sequenceCopier(cctx, &seqPos, inSeqs, inSeqsSize, ip, blockSize, cctx->appliedParams.searchForExternalRepcodes);
        FORWARD_IF_ERROR(additionalByteAdjustment, "Bad sequence copy");
        blockSize -= additionalByteAdjustment;

        /* If blocks are too small, emit as a nocompress block */
        /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
         * additional 1. We need to revisit and change this logic to be more consistent */
        if (blockSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "Nocompress block failed");
            DEBUGLOG(5, "Block too small, writing out nocompress block: cSize: %zu", cBlockSize);
            cSize += cBlockSize;
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            continue;
        }

        RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "not enough dstCapacity to write a new compressed block");
        compressedSeqsSize = ZSTD_entropyCompressSeqStore(&cctx->seqStore,
                                &cctx->blockState.prevCBlock->entropy, &cctx->blockState.nextCBlock->entropy,
                                &cctx->appliedParams,
                                op + ZSTD_blockHeaderSize /* Leave space for block header */, dstCapacity - ZSTD_blockHeaderSize,
                                blockSize,
                                cctx->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                                cctx->bmi2);
        FORWARD_IF_ERROR(compressedSeqsSize, "Compressing sequences of block failed");
        DEBUGLOG(5, "Compressed sequences size: %zu", compressedSeqsSize);

        if (!cctx->isFirstBlock &&
            ZSTD_maybeRLE(&cctx->seqStore) &&
            ZSTD_isRLE(ip, blockSize)) {
            /* We don't want to emit our first block as a RLE even if it qualifies because
            * doing so will cause the decoder (cli only) to throw a "should consume all input error."
            * This is only an issue for zstd <= v1.4.3
            */
            compressedSeqsSize = 1;
        }

        if (compressedSeqsSize == 0) {
            /* ZSTD_noCompressBlock writes the block header as well */
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "ZSTD_noCompressBlock failed");
            DEBUGLOG(5, "Writing out nocompress block, size: %zu", cBlockSize);
        } else if (compressedSeqsSize == 1) {
            cBlockSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "ZSTD_rleCompressBlock failed");
            DEBUGLOG(5, "Writing out RLE block, size: %zu", cBlockSize);
        } else {
            U32 cBlockHeader;
            /* Error checking and repcodes update */
            ZSTD_blockState_confirmRepcodesAndEntropyTables(&cctx->blockState);
            if (cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
                cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

            /* Write block header into beginning of block*/
            cBlockHeader = lastBlock + (((U32)bt_compressed)<<1) + (U32)(compressedSeqsSize << 3);
            MEM_writeLE24(op, cBlockHeader);
            cBlockSize = ZSTD_blockHeaderSize + compressedSeqsSize;
            DEBUGLOG(5, "Writing out compressed block, size: %zu", cBlockSize);
        }

        cSize += cBlockSize;

        if (lastBlock) {
            break;
        } else {
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            cctx->isFirstBlock = 0;
        }
        DEBUGLOG(5, "cSize running total: %zu (remaining dstCapacity=%zu)", cSize, dstCapacity);
    }

    DEBUGLOG(4, "cSize final total: %zu", cSize);
    return cSize;
}